

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldsTable.cpp
# Opt level: O0

void __thiscall ser::FieldsTable::RegisterField(FieldsTable *this,DataFieldInfo *dataFieldInfo)

{
  undefined8 other;
  bool bVar1;
  string *psVar2;
  SerializationException *this_00;
  mapped_type *this_01;
  undefined1 local_b0 [8];
  SerializationException exception;
  undefined1 local_68 [8];
  string msg;
  undefined1 local_38 [8];
  string name;
  DataFieldInfo *dataFieldInfo_local;
  FieldsTable *this_local;
  
  name.field_2._8_8_ = dataFieldInfo;
  psVar2 = DataFieldInfo::name_abi_cxx11_(dataFieldInfo);
  std::__cxx11::string::string((string *)local_38,(string *)psVar2);
  bVar1 = HasField(this,(string *)local_38);
  other = name.field_2._8_8_;
  if (!bVar1) {
    this_01 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::DataFieldInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::DataFieldInfo>_>_>
              ::operator[](&this->data_,(key_type *)local_38);
    DataFieldInfo::operator=(this_01,(DataFieldInfo *)other);
    std::__cxx11::string::~string((string *)local_38);
    return;
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&exception.message_.field_2 + 8),"Error: trying to register the field ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&exception.message_.field_2 + 8),", which is already registered\n");
  std::__cxx11::string::~string((string *)(exception.message_.field_2._M_local_buf + 8));
  SerializationException::SerializationException((SerializationException *)local_b0);
  SerializationException::Init((SerializationException *)local_b0,(string *)local_68);
  this_00 = (SerializationException *)__cxa_allocate_exception(0x28);
  SerializationException::SerializationException(this_00,(SerializationException *)local_b0);
  __cxa_throw(this_00,&SerializationException::typeinfo,
              SerializationException::~SerializationException);
}

Assistant:

void FieldsTable::RegisterField(const DataFieldInfo& dataFieldInfo)
{
    const std::string name = dataFieldInfo.name();

    if (HasField(name))
    {
        // Field is already registered
        std::string msg = "Error: trying to register the field " + name
                        + ", which is already registered\n";
        SerializationException exception;
        exception.Init(msg);
        throw exception;
    }

    // Register field
    data_[name] = dataFieldInfo;
}